

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O3

int ms5837_conversion_and_read_adc(MS5837 *pMS5837,uint8_t cmd,uint32_t *adc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar recvbuf [3];
  timespec local_30;
  
  iVar2 = ms5837_write_command(pMS5837,cmd);
  iVar3 = 1;
  if (iVar2 == 0) {
    uVar1 = pMS5837->conversion_time[cmd >> 1 & 7];
    local_30.tv_sec = (ulong)uVar1 / 1000000;
    local_30.tv_nsec = (long)((uVar1 / 1000 + (uVar1 / 1000000) * -1000) * 1000000);
    nanosleep(&local_30,(timespec *)0x0);
    iVar2 = ms5837_write_command(pMS5837,'\0');
    if (iVar2 == 0) {
      local_30.tv_sec = local_30.tv_sec & 0xffffffffff000000;
      iVar2 = ReadAllI2CBus(&pMS5837->I2CBus,(uint8 *)&local_30,3);
      if (iVar2 == 0) {
        if ((pMS5837->bSaveRawData != 0) && ((FILE *)pMS5837->pfSaveFile != (FILE *)0x0)) {
          fwrite(&local_30,3,1,(FILE *)pMS5837->pfSaveFile);
          fflush((FILE *)pMS5837->pfSaveFile);
        }
        *adc = (uint)local_30.tv_sec._2_1_ |
               (uint)local_30.tv_sec._1_1_ << 8 | (uint)(byte)local_30.tv_sec << 0x10;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

inline int ms5837_conversion_and_read_adc(MS5837* pMS5837, uint8_t cmd, uint32_t *adc)
{
	unsigned char recvbuf[3];
	int recvbuflen = 0;

	if (ms5837_write_command(pMS5837, cmd) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// delay conversion depending on resolution
	mSleep(pMS5837->conversion_time[ (cmd & MS5837_CONVERSION_OSR_MASK)/2 ]/1000 );
	
	// Send the read command
	if (ms5837_write_command(pMS5837, MS5837_READ_ADC) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 3;

	if (ReadAllI2CBus(&pMS5837->I2CBus, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	*adc = ((uint32_t)recvbuf[0] << 16) | ((uint32_t)recvbuf[1] << 8) | recvbuf[2];
	
	return EXIT_SUCCESS;
}